

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O2

QString * __thiscall
QCborValue::toDiagnosticNotation
          (QString *__return_storage_ptr__,QCborValue *this,DiagnosticNotationOptions opts)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined1 local_88 [88];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = 0;
  local_88._0_8_ = (Data *)0x0;
  local_88._8_8_ = (int *)0x0;
  latin1.m_size =
       (ulong)((uint)opts.super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>.
                     super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i & 1);
  pcVar1 = "\n";
  if (((uint)opts.super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>.
             super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i & 1) == 0) {
    pcVar1 = "";
  }
  latin1.m_data = pcVar1;
  QString::QString((QString *)(local_88 + 0x18),latin1);
  local_88._48_8_ = (Data *)0x0;
  local_88._56_8_ = (char16_t *)0x0;
  local_88._64_8_ = 0;
  local_88._76_4_ = 0;
  local_88._72_4_ =
       opts.super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>.
       super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i;
  QList<int>::append((QList<int> *)local_88,0x17);
  anon_unknown.dwarf_953179::DiagnosticNotation::appendValue
            ((DiagnosticNotation *)local_88,(QCborValue *)this);
  (__return_storage_ptr__->d).d = (Data *)local_88._48_8_;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_88._56_8_;
  (__return_storage_ptr__->d).size = local_88._64_8_;
  if ((Data *)local_88._48_8_ != (Data *)0x0) {
    LOCK();
    (((QArrayData *)local_88._48_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_88._48_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  anon_unknown.dwarf_953179::DiagnosticNotation::~DiagnosticNotation((DiagnosticNotation *)local_88)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCborValue::toDiagnosticNotation(DiagnosticNotationOptions opts) const
{
    return DiagnosticNotation::create(*this, opts);
}